

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_SHA2.c
# Opt level: O0

Hacl_Streaming_Types_error_code
update_224_256(Hacl_Streaming_MD_state_32 *state,uint8_t *chunk,uint32_t chunk_len)

{
  ulong uVar1;
  uint32_t *puVar2;
  uint8_t *puVar3;
  uint uVar4;
  uint len;
  uint8_t *dst_1;
  uint8_t *data2_1;
  uint8_t *data1_1;
  uint32_t data2_len_1;
  uint32_t data1_len_1;
  uint32_t n_blocks_1;
  uint32_t ite_1;
  uint32_t sz1_2;
  uint64_t total_len1_2;
  uint8_t *buf_2;
  uint32_t *block_state1_2;
  Hacl_Streaming_MD_state_32 s10;
  uint64_t total_len2_1;
  uint8_t *buf2_1;
  uint32_t sz10;
  uint64_t total_len10;
  uint8_t *buf0;
  uint32_t *block_state10;
  Hacl_Streaming_MD_state_32 s1_2;
  uint8_t *chunk2;
  uint8_t *chunk1;
  uint32_t diff;
  uint8_t *dst;
  uint8_t *data2;
  uint8_t *data1;
  uint32_t data2_len;
  uint32_t data1_len;
  uint32_t n_blocks;
  uint32_t ite;
  uint32_t sz1_1;
  uint64_t total_len1_1;
  uint8_t *buf_1;
  uint32_t *block_state1_1;
  Hacl_Streaming_MD_state_32 s1_1;
  uint64_t total_len2;
  uint8_t *buf2;
  uint32_t sz1;
  uint64_t total_len1;
  uint8_t *buf;
  uint32_t *block_state1;
  Hacl_Streaming_MD_state_32 s1;
  uint32_t sz;
  uint64_t total_len;
  Hacl_Streaming_MD_state_32 s;
  uint32_t chunk_len_local;
  uint8_t *chunk_local;
  Hacl_Streaming_MD_state_32 *state_local;
  
  uVar1 = state->total_len;
  if (0x1fffffffffffffff - uVar1 < (ulong)chunk_len) {
    state_local._7_1_ = '\x03';
  }
  else {
    if (((uVar1 & 0x3f) == 0) && (uVar1 != 0)) {
      s1.total_len._4_4_ = 0x40;
    }
    else {
      s1.total_len._4_4_ = (uint)uVar1 & 0x3f;
    }
    if (0x40 - s1.total_len._4_4_ < chunk_len) {
      if (s1.total_len._4_4_ == 0) {
        puVar2 = state->block_state;
        puVar3 = state->buf;
        uVar1 = state->total_len;
        if (((uVar1 & 0x3f) == 0) && (uVar1 != 0)) {
          n_blocks = 0x40;
        }
        else {
          n_blocks = (uint)uVar1 & 0x3f;
        }
        if (n_blocks != 0) {
          Hacl_Hash_SHA2_sha256_update_nblocks(0x40,puVar3,puVar2);
        }
        if (((chunk_len & 0x3f) == 0) && (chunk_len != 0)) {
          data1_len = 0x40;
        }
        else {
          data1_len = chunk_len & 0x3f;
        }
        uVar4 = chunk_len - data1_len & 0xffffffc0;
        Hacl_Hash_SHA2_sha256_update_nblocks(uVar4,chunk,puVar2);
        memcpy(puVar3,chunk + uVar4,(ulong)(chunk_len - uVar4));
        state->block_state = puVar2;
        state->buf = puVar3;
        state->total_len = uVar1 + chunk_len;
      }
      else {
        uVar4 = 0x40 - s1.total_len._4_4_;
        puVar2 = state->block_state;
        puVar3 = state->buf;
        uVar1 = state->total_len;
        if (((uVar1 & 0x3f) == 0) && (uVar1 != 0)) {
          buf2_1._4_4_ = 0x40;
        }
        else {
          buf2_1._4_4_ = (uint)uVar1 & 0x3f;
        }
        memcpy(puVar3 + buf2_1._4_4_,chunk,(ulong)uVar4);
        state->block_state = puVar2;
        state->buf = puVar3;
        state->total_len = uVar1 + uVar4;
        puVar2 = state->block_state;
        puVar3 = state->buf;
        uVar1 = state->total_len;
        if (((uVar1 & 0x3f) == 0) && (uVar1 != 0)) {
          n_blocks_1 = 0x40;
        }
        else {
          n_blocks_1 = (uint)uVar1 & 0x3f;
        }
        if (n_blocks_1 != 0) {
          Hacl_Hash_SHA2_sha256_update_nblocks(0x40,puVar3,puVar2);
        }
        if (((chunk_len - uVar4 & 0x3f) == 0) && (chunk_len != uVar4)) {
          data1_len_1 = 0x40;
        }
        else {
          data1_len_1 = chunk_len - uVar4 & 0x3f;
        }
        len = (chunk_len - uVar4) - data1_len_1 & 0xffffffc0;
        Hacl_Hash_SHA2_sha256_update_nblocks(len,chunk + uVar4,puVar2);
        memcpy(puVar3,chunk + uVar4 + len,(ulong)((chunk_len - uVar4) - len));
        state->block_state = puVar2;
        state->buf = puVar3;
        state->total_len = uVar1 + (chunk_len - uVar4);
      }
    }
    else {
      puVar2 = state->block_state;
      puVar3 = state->buf;
      uVar1 = state->total_len;
      if (((uVar1 & 0x3f) == 0) && (uVar1 != 0)) {
        buf2._4_4_ = 0x40;
      }
      else {
        buf2._4_4_ = (uint)uVar1 & 0x3f;
      }
      memcpy(puVar3 + buf2._4_4_,chunk,(ulong)chunk_len);
      state->block_state = puVar2;
      state->buf = puVar3;
      state->total_len = uVar1 + chunk_len;
    }
    state_local._7_1_ = '\0';
  }
  return state_local._7_1_;
}

Assistant:

static inline Hacl_Streaming_Types_error_code
update_224_256(Hacl_Streaming_MD_state_32 *state, uint8_t *chunk, uint32_t chunk_len)
{
  Hacl_Streaming_MD_state_32 s = *state;
  uint64_t total_len = s.total_len;
  if ((uint64_t)chunk_len > 2305843009213693951ULL - total_len)
  {
    return Hacl_Streaming_Types_MaximumLengthExceeded;
  }
  uint32_t sz;
  if (total_len % (uint64_t)64U == 0ULL && total_len > 0ULL)
  {
    sz = 64U;
  }
  else
  {
    sz = (uint32_t)(total_len % (uint64_t)64U);
  }
  if (chunk_len <= 64U - sz)
  {
    Hacl_Streaming_MD_state_32 s1 = *state;
    uint32_t *block_state1 = s1.block_state;
    uint8_t *buf = s1.buf;
    uint64_t total_len1 = s1.total_len;
    uint32_t sz1;
    if (total_len1 % (uint64_t)64U == 0ULL && total_len1 > 0ULL)
    {
      sz1 = 64U;
    }
    else
    {
      sz1 = (uint32_t)(total_len1 % (uint64_t)64U);
    }
    uint8_t *buf2 = buf + sz1;
    memcpy(buf2, chunk, chunk_len * sizeof (uint8_t));
    uint64_t total_len2 = total_len1 + (uint64_t)chunk_len;
    *state
    =
      (
        (Hacl_Streaming_MD_state_32){
          .block_state = block_state1,
          .buf = buf,
          .total_len = total_len2
        }
      );
  }
  else if (sz == 0U)
  {
    Hacl_Streaming_MD_state_32 s1 = *state;
    uint32_t *block_state1 = s1.block_state;
    uint8_t *buf = s1.buf;
    uint64_t total_len1 = s1.total_len;
    uint32_t sz1;
    if (total_len1 % (uint64_t)64U == 0ULL && total_len1 > 0ULL)
    {
      sz1 = 64U;
    }
    else
    {
      sz1 = (uint32_t)(total_len1 % (uint64_t)64U);
    }
    if (!(sz1 == 0U))
    {
      Hacl_Hash_SHA2_sha256_update_nblocks(64U, buf, block_state1);
    }
    uint32_t ite;
    if ((uint64_t)chunk_len % (uint64_t)64U == 0ULL && (uint64_t)chunk_len > 0ULL)
    {
      ite = 64U;
    }
    else
    {
      ite = (uint32_t)((uint64_t)chunk_len % (uint64_t)64U);
    }
    uint32_t n_blocks = (chunk_len - ite) / 64U;
    uint32_t data1_len = n_blocks * 64U;
    uint32_t data2_len = chunk_len - data1_len;
    uint8_t *data1 = chunk;
    uint8_t *data2 = chunk + data1_len;
    Hacl_Hash_SHA2_sha256_update_nblocks(data1_len / 64U * 64U, data1, block_state1);
    uint8_t *dst = buf;
    memcpy(dst, data2, data2_len * sizeof (uint8_t));
    *state
    =
      (
        (Hacl_Streaming_MD_state_32){
          .block_state = block_state1,
          .buf = buf,
          .total_len = total_len1 + (uint64_t)chunk_len
        }
      );
  }
  else
  {
    uint32_t diff = 64U - sz;
    uint8_t *chunk1 = chunk;
    uint8_t *chunk2 = chunk + diff;
    Hacl_Streaming_MD_state_32 s1 = *state;
    uint32_t *block_state10 = s1.block_state;
    uint8_t *buf0 = s1.buf;
    uint64_t total_len10 = s1.total_len;
    uint32_t sz10;
    if (total_len10 % (uint64_t)64U == 0ULL && total_len10 > 0ULL)
    {
      sz10 = 64U;
    }
    else
    {
      sz10 = (uint32_t)(total_len10 % (uint64_t)64U);
    }
    uint8_t *buf2 = buf0 + sz10;
    memcpy(buf2, chunk1, diff * sizeof (uint8_t));
    uint64_t total_len2 = total_len10 + (uint64_t)diff;
    *state
    =
      (
        (Hacl_Streaming_MD_state_32){
          .block_state = block_state10,
          .buf = buf0,
          .total_len = total_len2
        }
      );
    Hacl_Streaming_MD_state_32 s10 = *state;
    uint32_t *block_state1 = s10.block_state;
    uint8_t *buf = s10.buf;
    uint64_t total_len1 = s10.total_len;
    uint32_t sz1;
    if (total_len1 % (uint64_t)64U == 0ULL && total_len1 > 0ULL)
    {
      sz1 = 64U;
    }
    else
    {
      sz1 = (uint32_t)(total_len1 % (uint64_t)64U);
    }
    if (!(sz1 == 0U))
    {
      Hacl_Hash_SHA2_sha256_update_nblocks(64U, buf, block_state1);
    }
    uint32_t ite;
    if
    ((uint64_t)(chunk_len - diff) % (uint64_t)64U == 0ULL && (uint64_t)(chunk_len - diff) > 0ULL)
    {
      ite = 64U;
    }
    else
    {
      ite = (uint32_t)((uint64_t)(chunk_len - diff) % (uint64_t)64U);
    }
    uint32_t n_blocks = (chunk_len - diff - ite) / 64U;
    uint32_t data1_len = n_blocks * 64U;
    uint32_t data2_len = chunk_len - diff - data1_len;
    uint8_t *data1 = chunk2;
    uint8_t *data2 = chunk2 + data1_len;
    Hacl_Hash_SHA2_sha256_update_nblocks(data1_len / 64U * 64U, data1, block_state1);
    uint8_t *dst = buf;
    memcpy(dst, data2, data2_len * sizeof (uint8_t));
    *state
    =
      (
        (Hacl_Streaming_MD_state_32){
          .block_state = block_state1,
          .buf = buf,
          .total_len = total_len1 + (uint64_t)(chunk_len - diff)
        }
      );
  }
  return Hacl_Streaming_Types_Success;
}